

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dielectric.hpp
# Opt level: O3

Color __thiscall
DielectricBRDF::sample_f
          (DielectricBRDF *this,Color *albedo,vec3f *wo,vec3f *wi,float *pdf,Sampler *sampler)

{
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  float extraout_XMM0_Da;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Color CVar10;
  
  fVar7 = wo->z;
  fVar8 = *(float *)&(this->super_DiracBxDF).field_0x8;
  fVar3 = (float)(-(uint)(0.0 < fVar7) & (uint)fVar8 | ~-(uint)(0.0 < fVar7) & (uint)(1.0 / fVar8));
  fVar9 = ABS(fVar7);
  fVar8 = 1.0 - fVar9 * fVar9;
  if (fVar8 <= 0.0) {
    fVar8 = 0.0;
  }
  fVar6 = SQRT(fVar8) / fVar3;
  fVar8 = 1.0;
  if (fVar6 < 1.0) {
    fVar6 = 1.0 - fVar6 * fVar6;
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      fVar6 = SQRT(fVar6);
    }
    fVar7 = (fVar3 * fVar9 - fVar6) / (fVar3 * fVar9 + fVar6);
    fVar8 = (fVar9 - fVar3 * fVar6) / (fVar3 * fVar6 + fVar9);
    fVar8 = (fVar8 * fVar8 + fVar7 * fVar7) * 0.5;
    if ((fVar8 != 1.0) || (NAN(fVar8))) {
      (**sampler->_vptr_Sampler)(sampler);
      fVar7 = wo->z;
      if (fVar8 <= extraout_XMM0_Da) {
        uVar2._0_4_ = wo->x;
        uVar2._4_4_ = wo->y;
        auVar4._0_8_ = uVar2 ^ 0x8000000080000000;
        auVar4._8_4_ = 0x80000000;
        auVar4._12_4_ = 0x80000000;
        auVar5._4_4_ = fVar3;
        auVar5._0_4_ = fVar3;
        auVar5._8_8_ = 0;
        auVar5 = divps(auVar4,auVar5);
        wi->x = (float)(int)auVar5._0_8_;
        wi->y = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
        wi->z = (fVar6 * -fVar7) / ABS(fVar7);
        *pdf = 1.0 - fVar8;
        fVar8 = (1.0 - fVar8) / (ABS(wi->z) * fVar3 * fVar3);
        goto LAB_0013c9b9;
      }
    }
    else {
      fVar7 = wo->z;
      fVar8 = 1.0;
    }
  }
  uVar1._0_4_ = wo->x;
  uVar1._4_4_ = wo->y;
  wi->x = (float)(int)(uVar1 ^ 0x8000000080000000);
  wi->y = (float)(int)((uVar1 ^ 0x8000000080000000) >> 0x20);
  wi->z = fVar7;
  *pdf = fVar8;
  fVar8 = fVar8 / ABS(wi->z);
LAB_0013c9b9:
  CVar10.y = fVar8;
  CVar10.x = fVar8;
  CVar10.z = fVar8;
  return CVar10;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		float ior = wo.z>0? IOR: 1/IOR;
		float cost;
		float r = reflectivity(fabs(wo.z), cost, ior);

		if (r == 1 || sampler.get1f()<r) // reflected
		{
			wi = vec3f(-wo.x, -wo.y, wo.z);
			pdf = r;
			return r / fabs(wi.z);
		}
		else // transmitted
		{
			wi = vec3f(-wo.x/ior, -wo.y/ior, -wo.z * cost/fabs(wo.z));
			pdf = 1-r;
			return (1-r) / (fabs(wi.z) * ior * ior);
			// the 1/ior^2 coefficient is used to convert energy to radiance
			// see note_refract_radiance
		}
	}